

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFNMatrix<3,_TPZFlopCounter>::TPZFNMatrix
          (TPZFNMatrix<3,_TPZFlopCounter> *this,int64_t row,int64_t col,TPZFlopCounter *val)

{
  (this->super_TPZFMatrix<TPZFlopCounter>).super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_016812c8;
  TPZFMatrix<TPZFlopCounter>::TPZFMatrix
            (&this->super_TPZFMatrix<TPZFlopCounter>,&PTR_PTR_01681580,row,col,this->fBuf,3);
  (this->super_TPZFMatrix<TPZFlopCounter>).super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_016812c8;
  TPZFMatrix<TPZFlopCounter>::operator=
            (&this->super_TPZFMatrix<TPZFlopCounter>,(TPZFlopCounter)val->fVal);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }